

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  bool bVar1;
  FILE *__stream;
  undefined8 extraout_RAX;
  string *this_00;
  size_type *this_01;
  FilePath FStack_218;
  FilePath FStack_1f8;
  string sStack_1d8;
  stringstream asStack_1b8 [16];
  ostream aoStack_1a8 [112];
  ios_base aiStack_138 [264];
  XmlUnitTestResultPrinter *pXStack_30;
  allocator local_9;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_00158630;
  this_00 = &this->output_file_;
  std::__cxx11::string::string((string *)this_00,output_file,&local_9);
  if (((this->output_file_)._M_dataplus._M_p != (pointer)0x0) &&
     ((this->output_file_)._M_string_length != 0)) {
    return;
  }
  internal::XmlUnitTestResultPrinter();
  this_01 = &this_00->_M_string_length;
  pXStack_30 = this;
  FilePath::FilePath(&FStack_1f8,(string *)this_01);
  FilePath::RemoveFileName(&FStack_218,&FStack_1f8);
  bVar1 = FilePath::CreateDirectoriesRecursively(&FStack_218);
  if (bVar1) {
    __stream = fopen((char *)*this_01,"w");
    if (__stream != (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream(asStack_1b8);
      PrintXmlUnitTest(aoStack_1a8,(UnitTest *)output_file);
      StringStreamToString(&sStack_1d8,(stringstream *)asStack_1b8);
      fputs(sStack_1d8._M_dataplus._M_p,__stream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1d8._M_dataplus._M_p != &sStack_1d8.field_2) {
        operator_delete(sStack_1d8._M_dataplus._M_p);
      }
      fclose(__stream);
      std::__cxx11::stringstream::~stringstream(asStack_1b8);
      std::ios_base::~ios_base(aiStack_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)FStack_218.pathname_._M_dataplus._M_p != &FStack_218.pathname_.field_2) {
        operator_delete(FStack_218.pathname_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)FStack_1f8.pathname_._M_dataplus._M_p != &FStack_1f8.pathname_.field_2) {
        operator_delete(FStack_1f8.pathname_._M_dataplus._M_p);
      }
      return;
    }
  }
  OnTestIterationEnd((XmlUnitTestResultPrinter *)this_01);
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(aiStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FStack_218.pathname_._M_dataplus._M_p != &FStack_218.pathname_.field_2) {
    operator_delete(FStack_218.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FStack_1f8.pathname_._M_dataplus._M_p != &FStack_1f8.pathname_.field_2) {
    operator_delete(FStack_1f8.pathname_._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.c_str() == NULL || output_file_.empty()) {
    fprintf(stderr, "XML output file may not be null\n");
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
}